

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockd.h
# Opt level: O2

int av1_allow_palette(int allow_screen_content_tools,BLOCK_SIZE sb_type)

{
  return (int)((BLOCK_8X4 < sb_type && (sb_type & ~BLOCK_8X4) != BLOCK_64X128) &&
              ((sb_type & ~BLOCK_4X8) != BLOCK_128X64 && allow_screen_content_tools != 0));
}

Assistant:

static inline int av1_allow_palette(int allow_screen_content_tools,
                                    BLOCK_SIZE sb_type) {
  assert(sb_type < BLOCK_SIZES_ALL);
  return allow_screen_content_tools &&
         block_size_wide[sb_type] <= MAX_PALETTE_BLOCK_WIDTH &&
         block_size_high[sb_type] <= MAX_PALETTE_BLOCK_HEIGHT &&
         sb_type >= BLOCK_8X8;
}